

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__accept(int sockfd)

{
  int iVar1;
  int *piVar2;
  int local_18;
  int err;
  int peerfd;
  int sockfd_local;
  
  if (sockfd < 0) {
    __assert_fail("sockfd >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                  ,0x1cb,"int uv__accept(int)");
  }
LAB_00a01de4:
  do {
    if (uv__accept::no_accept4 == 0) {
      iVar1 = uv__accept4(sockfd,(sockaddr *)0x0,(socklen_t *)0x0,0x80800);
      if (iVar1 != -1) {
        return iVar1;
      }
      piVar2 = __errno_location();
      if (*piVar2 == 4) goto LAB_00a01de4;
      piVar2 = __errno_location();
      if (*piVar2 != 0x26) {
        piVar2 = __errno_location();
        return -*piVar2;
      }
      uv__accept::no_accept4 = 1;
    }
    iVar1 = accept(sockfd,(sockaddr *)0x0,(socklen_t *)0x0);
    if (iVar1 != -1) {
      local_18 = uv__cloexec_ioctl(iVar1,1);
      if (local_18 == 0) {
        local_18 = uv__nonblock_ioctl(iVar1,1);
      }
      if (local_18 == 0) {
        return iVar1;
      }
      uv__close(iVar1);
      return local_18;
    }
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
  } while( true );
}

Assistant:

int uv__accept(int sockfd) {
  int peerfd;
  int err;

  assert(sockfd >= 0);

  while (1) {
#if defined(__linux__) || (defined(__FreeBSD__) && __FreeBSD__ >= 10)
    static int no_accept4;

    if (no_accept4)
      goto skip;

    peerfd = uv__accept4(sockfd,
                         NULL,
                         NULL,
                         UV__SOCK_NONBLOCK|UV__SOCK_CLOEXEC);
    if (peerfd != -1)
      return peerfd;

    if (errno == EINTR)
      continue;

    if (errno != ENOSYS)
      return -errno;

    no_accept4 = 1;
skip:
#endif

    peerfd = accept(sockfd, NULL, NULL);
    if (peerfd == -1) {
      if (errno == EINTR)
        continue;
      return -errno;
    }

    err = uv__cloexec(peerfd, 1);
    if (err == 0)
      err = uv__nonblock(peerfd, 1);

    if (err) {
      uv__close(peerfd);
      return err;
    }

    return peerfd;
  }
}